

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O0

MacroProps *
icu_63::number::impl::NumberPropertyMapper::oldToNew
          (MacroProps *__return_storage_ptr__,DecimalFormatProperties *properties,
          DecimalFormatSymbols *symbols,DecimalFormatWarehouse *warehouse,
          DecimalFormatProperties *exportedProperties,UErrorCode *status)

{
  FractionSignificantSettings *pFVar1;
  int32_t iVar2;
  int32_t iVar3;
  UBool UVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  UNumberCompactStyle UVar8;
  CurrencyPluralInfo *pCVar9;
  PluralRules *pPVar10;
  char16_t *currency_00;
  int *piVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  IntegerWidth IVar15;
  Notation NVar16;
  int32_t local_740;
  int local_718;
  int32_t local_6b4;
  int32_t local_6b0;
  int32_t local_6ac;
  int local_6a8;
  int local_6a4;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int32_t local_67c;
  int32_t local_678;
  int local_674;
  int local_670;
  int local_66c;
  byte local_632;
  double local_5f0;
  double increment_;
  int maxSig__1;
  int minSig__1;
  int maxFrac__1;
  int minFrac__1;
  PrecisionUnion local_5d0;
  UNumberFormatRoundingMode local_5c0;
  undefined1 local_5b8 [8];
  Precision rounding_;
  Precision local_540;
  Precision local_520;
  int local_500;
  int local_4fc;
  int minSig_;
  int maxSig_;
  Precision local_4d8;
  Precision local_4b8;
  Precision local_498;
  int local_478;
  int local_474;
  int maxFrac_;
  int minFrac_;
  int minInt_;
  int maxInt_;
  undefined4 local_460;
  int local_45c;
  anon_union_8_2_136a0349_for_fUnion aStack_458;
  int engineering;
  undefined1 local_450;
  anon_union_8_2_136a0349_for_fUnion local_448;
  undefined1 local_440;
  anon_union_8_2_136a0349_for_fUnion local_438;
  undefined1 local_430;
  anon_union_8_2_136a0349_for_fUnion local_42c;
  undefined1 local_424;
  anon_union_8_2_136a0349_for_fUnion local_420;
  undefined1 local_418;
  anon_union_8_2_136a0349_for_fUnion local_410;
  undefined1 local_408;
  anon_union_8_2_136a0349_for_fUnion local_400;
  undefined1 local_3f8;
  anon_union_8_2_136a0349_for_fUnion local_3f4;
  undefined1 local_3ec;
  Padder local_3e8;
  Padder local_3d4;
  Grouper local_3c8;
  Grouper local_3b8;
  anon_union_8_2_136a0349_for_fUnion local_3ac;
  bool local_3a4;
  Precision local_3a0;
  Precision local_380;
  Precision local_360;
  Precision local_340;
  Precision local_320;
  CurrencyPrecision local_300;
  Precision local_2e0;
  undefined1 local_2c0 [8];
  Precision precision;
  int32_t digits;
  bool explicitMinMaxSig;
  bool explicitMinMaxFrac;
  double dStack_290;
  RoundingMode roundingMode;
  double roundingIncrement;
  int32_t maxSig;
  int32_t minSig;
  int32_t minFrac;
  int32_t maxFrac;
  int32_t minInt;
  int32_t maxInt;
  CurrencySymbols local_250;
  UCurrencyUsage local_164;
  undefined1 local_160 [4];
  UCurrencyUsage currencyUsage;
  CurrencyUnit currency;
  DecimalFormatWarehouse *pDStack_138;
  bool useCurrency;
  AffixPatternProvider *affixProvider;
  undefined1 local_120 [8];
  Locale locale;
  UErrorCode *status_local;
  DecimalFormatProperties *exportedProperties_local;
  DecimalFormatWarehouse *warehouse_local;
  DecimalFormatSymbols *symbols_local;
  DecimalFormatProperties *properties_local;
  MacroProps *macros;
  
  locale._223_1_ = 0;
  MacroProps::MacroProps(__return_storage_ptr__);
  DecimalFormatSymbols::getLocale((Locale *)local_120,symbols);
  SymbolsWrapper::setTo(&__return_storage_ptr__->symbols,symbols);
  UVar4 = LocalPointerBase<icu_63::CurrencyPluralInfo>::isNull
                    ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)&properties->currencyPluralInfo
                    );
  if (UVar4 == '\0') {
    pCVar9 = LocalPointerBase<icu_63::CurrencyPluralInfo>::operator->
                       ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)
                        &properties->currencyPluralInfo);
    pPVar10 = CurrencyPluralInfo::getPluralRules(pCVar9);
    __return_storage_ptr__->rules = pPVar10;
  }
  UVar4 = LocalPointerBase<icu_63::CurrencyPluralInfo>::isNull
                    ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)&properties->currencyPluralInfo
                    );
  if (UVar4 == '\0') {
    pCVar9 = LocalPointerBase<icu_63::CurrencyPluralInfo>::operator*
                       ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)
                        &properties->currencyPluralInfo);
    CurrencyPluralInfoAffixProvider::setTo
              (&warehouse->currencyPluralInfoAPP,pCVar9,properties,status);
    PropertiesAffixPatternProvider::setToBogus(&warehouse->propertiesAPP);
    pDStack_138 = (DecimalFormatWarehouse *)&warehouse->currencyPluralInfoAPP;
  }
  else {
    CurrencyPluralInfoAffixProvider::setToBogus(&warehouse->currencyPluralInfoAPP);
    PropertiesAffixPatternProvider::setTo(&warehouse->propertiesAPP,properties,status);
    pDStack_138 = warehouse;
  }
  __return_storage_ptr__->affixProvider = (AffixPatternProvider *)pDStack_138;
  bVar5 = NullableValue<icu_63::CurrencyUnit>::isNull(&properties->currency);
  local_632 = 1;
  if (bVar5) {
    UVar4 = LocalPointerBase<icu_63::CurrencyPluralInfo>::isNull
                      ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)
                       &properties->currencyPluralInfo);
    local_632 = 1;
    if (UVar4 != '\0') {
      bVar5 = NullableValue<UCurrencyUsage>::isNull(&properties->currencyUsage);
      local_632 = 1;
      if (bVar5) {
        iVar7 = (*(pDStack_138->propertiesAPP).super_AffixPatternProvider._vptr_AffixPatternProvider
                  [5])();
        local_632 = (byte)iVar7;
      }
    }
  }
  currency._31_1_ = local_632 & 1;
  resolveCurrency((CurrencyUnit *)local_160,properties,(Locale *)local_120,status);
  local_164 = NullableValue<UCurrencyUsage>::getOrDefault
                        (&properties->currencyUsage,UCURR_USAGE_STANDARD);
  if ((currency._31_1_ & 1) != 0) {
    MeasureUnit::operator=(&__return_storage_ptr__->unit,(MeasureUnit *)local_160);
  }
  CurrencyUnit::CurrencyUnit((CurrencyUnit *)&minInt,(CurrencyUnit *)local_160);
  CurrencySymbols::CurrencySymbols
            (&local_250,(CurrencyUnit *)&minInt,(Locale *)local_120,symbols,status);
  CurrencySymbols::operator=(&warehouse->currencySymbols,&local_250);
  CurrencySymbols::~CurrencySymbols(&local_250);
  CurrencyUnit::~CurrencyUnit((CurrencyUnit *)&minInt);
  __return_storage_ptr__->currencySymbols = &warehouse->currencySymbols;
  maxFrac = properties->maximumIntegerDigits;
  minFrac = properties->minimumIntegerDigits;
  minSig = properties->maximumFractionDigits;
  maxSig = properties->minimumFractionDigits;
  roundingIncrement._4_4_ = properties->minimumSignificantDigits;
  roundingIncrement._0_4_ = properties->maximumSignificantDigits;
  dStack_290 = properties->roundingIncrement;
  digits = NullableValue<UNumberFormatRoundingMode>::getOrDefault
                     (&properties->roundingMode,UNUM_FOUND_HALFEVEN);
  bVar5 = maxSig == -1;
  bVar12 = minSig == -1;
  bVar13 = roundingIncrement._4_4_ == -1;
  bVar14 = roundingIncrement._0_4_ == -1;
  iVar2 = maxSig;
  iVar3 = minSig;
  if (((currency._31_1_ & 1) != 0) && ((maxSig == -1 || (minSig == -1)))) {
    currency_00 = CurrencyUnit::getISOCurrency((CurrencyUnit *)local_160);
    precision._28_4_ = ucurr_getDefaultFractionDigitsForUsage_63(currency_00,local_164,status);
    if ((maxSig != -1) || (iVar2 = precision._28_4_, iVar3 = precision._28_4_, minSig != -1)) {
      if (maxSig == -1) {
        piVar11 = std::min<int>(&minSig,(int *)&precision.field_0x1c);
        iVar2 = *piVar11;
        iVar3 = minSig;
      }
      else {
        piVar11 = std::max<int>(&maxSig,(int *)&precision.field_0x1c);
        iVar2 = maxSig;
        iVar3 = *piVar11;
      }
    }
  }
  minSig = iVar3;
  maxSig = iVar2;
  if ((minFrac == 0) && (minSig != 0)) {
    if (maxSig < 1) {
      local_66c = 1;
    }
    else {
      local_66c = maxSig;
    }
    maxSig = local_66c;
    if (minSig < 0) {
      local_670 = -1;
    }
    else {
      if (minSig < local_66c) {
        local_674 = local_66c;
      }
      else {
        local_674 = minSig;
      }
      local_670 = local_674;
    }
    minSig = local_670;
    minFrac = 0;
    if (maxFrac < 0) {
      local_678 = -1;
    }
    else {
      if (maxFrac < 1000) {
        local_67c = maxFrac;
      }
      else {
        local_67c = -1;
      }
      local_678 = local_67c;
    }
    maxFrac = local_678;
  }
  else {
    if (maxSig < 0) {
      local_680 = 0;
    }
    else {
      local_680 = maxSig;
    }
    maxSig = local_680;
    if (minSig < 0) {
      local_684 = -1;
    }
    else {
      if (minSig < local_680) {
        local_688 = local_680;
      }
      else {
        local_688 = minSig;
      }
      local_684 = local_688;
    }
    minSig = local_684;
    if (minFrac < 1) {
      local_68c = 1;
    }
    else {
      if (minFrac < 1000) {
        local_690 = minFrac;
      }
      else {
        local_690 = 1;
      }
      local_68c = local_690;
    }
    minFrac = local_68c;
    if (maxFrac < 0) {
      local_694 = -1;
    }
    else {
      if (maxFrac < local_68c) {
        local_698 = local_68c;
      }
      else {
        if (maxFrac < 1000) {
          local_69c = maxFrac;
        }
        else {
          local_69c = -1;
        }
        local_698 = local_69c;
      }
      local_694 = local_698;
    }
    maxFrac = local_694;
  }
  Precision::Precision((Precision *)local_2c0);
  bVar6 = NullableValue<UCurrencyUsage>::isNull(&properties->currencyUsage);
  if (bVar6) {
    if ((dStack_290 != 0.0) || (NAN(dStack_290))) {
      Precision::constructIncrement((IncrementPrecision *)&local_320,dStack_290,maxSig);
      local_2c0 = (undefined1  [8])local_320._0_8_;
      precision._0_8_ = local_320.fUnion.fracSig;
      precision.fUnion._0_2_ = local_320.fUnion.increment.fMinFrac;
      precision.fUnion._2_2_ = local_320.fUnion.increment.fMaxFrac;
      precision.fUnion._4_2_ = local_320.fUnion._12_2_;
      precision.fUnion._6_2_ = local_320.fUnion._14_2_;
      precision.fUnion._8_4_ = local_320.fRoundingMode;
    }
    else if (bVar13 && bVar14) {
      if (bVar5 && bVar12) {
        if ((currency._31_1_ & 1) != 0) {
          Precision::constructCurrency((CurrencyPrecision *)&local_380,local_164);
          local_2c0 = (undefined1  [8])local_380._0_8_;
          precision._0_8_ = local_380.fUnion.fracSig;
          precision.fUnion._0_2_ = local_380.fUnion.increment.fMinFrac;
          precision.fUnion._2_2_ = local_380.fUnion.increment.fMaxFrac;
          precision.fUnion._4_2_ = local_380.fUnion._12_2_;
          precision.fUnion._6_2_ = local_380.fUnion._14_2_;
          precision.fUnion._8_4_ = local_380.fRoundingMode;
        }
      }
      else {
        Precision::constructFraction((FractionPrecision *)&local_360,maxSig,minSig);
        local_2c0 = (undefined1  [8])local_360._0_8_;
        precision._0_8_ = local_360.fUnion.fracSig;
        precision.fUnion._0_2_ = local_360.fUnion.increment.fMinFrac;
        precision.fUnion._2_2_ = local_360.fUnion.increment.fMaxFrac;
        precision.fUnion._4_2_ = local_360.fUnion._12_2_;
        precision.fUnion._6_2_ = local_360.fUnion._14_2_;
        precision.fUnion._8_4_ = local_360.fRoundingMode;
      }
    }
    else {
      if (roundingIncrement._4_4_ < 1) {
        local_6a4 = 1;
      }
      else {
        if (roundingIncrement._4_4_ < 1000) {
          local_6a8 = roundingIncrement._4_4_;
        }
        else {
          local_6a8 = 999;
        }
        local_6a4 = local_6a8;
      }
      roundingIncrement._4_4_ = local_6a4;
      if (roundingIncrement._0_4_ < 0) {
        local_6ac = 999;
      }
      else {
        if (roundingIncrement._0_4_ < local_6a4) {
          local_6b0 = local_6a4;
        }
        else {
          if (roundingIncrement._0_4_ < 1000) {
            local_6b4 = roundingIncrement._0_4_;
          }
          else {
            local_6b4 = 999;
          }
          local_6b0 = local_6b4;
        }
        local_6ac = local_6b0;
      }
      roundingIncrement._0_4_ = local_6ac;
      Precision::constructSignificant(&local_340,local_6a4,local_6ac);
      local_2c0 = (undefined1  [8])local_340._0_8_;
      precision._0_8_ = local_340.fUnion.fracSig;
      precision.fUnion._0_2_ = local_340.fUnion.increment.fMinFrac;
      precision.fUnion._2_2_ = local_340.fUnion.increment.fMaxFrac;
      precision.fUnion._4_2_ = local_340.fUnion._12_2_;
      precision.fUnion._6_2_ = local_340.fUnion._14_2_;
      precision.fUnion._8_4_ = local_340.fRoundingMode;
    }
  }
  else {
    Precision::constructCurrency(&local_300,local_164);
    CurrencyPrecision::withCurrency(&local_2e0,&local_300,(CurrencyUnit *)local_160);
    local_2c0 = (undefined1  [8])local_2e0._0_8_;
    precision._0_8_ = local_2e0.fUnion.fracSig;
    precision.fUnion._0_2_ = local_2e0.fUnion.increment.fMinFrac;
    precision.fUnion._2_2_ = local_2e0.fUnion.increment.fMaxFrac;
    precision.fUnion._4_2_ = local_2e0.fUnion._12_2_;
    precision.fUnion._6_2_ = local_2e0.fUnion._14_2_;
    precision.fUnion._8_4_ = local_2e0.fRoundingMode;
  }
  bVar5 = Precision::isBogus((Precision *)local_2c0);
  if (!bVar5) {
    Precision::withMode(&local_3a0,(Precision *)local_2c0,digits);
    local_2c0 = (undefined1  [8])local_3a0._0_8_;
    precision._0_8_ = local_3a0.fUnion.fracSig;
    precision.fUnion._0_2_ = local_3a0.fUnion.increment.fMinFrac;
    precision.fUnion._2_2_ = local_3a0.fUnion.increment.fMaxFrac;
    precision.fUnion._4_2_ = local_3a0.fUnion._12_2_;
    precision.fUnion._6_2_ = local_3a0.fUnion._14_2_;
    precision.fUnion._8_4_ = local_3a0.fRoundingMode;
    (__return_storage_ptr__->precision).fType = local_3a0.fType;
    *(undefined4 *)&(__return_storage_ptr__->precision).field_0x4 = local_3a0._4_4_;
    (__return_storage_ptr__->precision).fUnion.fracSig = local_3a0.fUnion.fracSig;
    pFVar1 = (FractionSignificantSettings *)((long)&(__return_storage_ptr__->precision).fUnion + 8);
    pFVar1->fMinFrac = local_3a0.fUnion._8_2_;
    pFVar1->fMaxFrac = local_3a0.fUnion.increment.fMaxFrac;
    pFVar1->fMinSig = local_3a0.fUnion._12_2_;
    pFVar1->fMaxSig = local_3a0.fUnion._14_2_;
    (__return_storage_ptr__->precision).fRoundingMode = local_3a0.fRoundingMode;
  }
  IntegerWidth::IntegerWidth
            ((IntegerWidth *)&local_3ac.minMaxInt,(digits_t)minFrac,(digits_t)maxFrac,
             (bool)(properties->formatFailIfMoreThanMaxDigits & 1));
  (__return_storage_ptr__->integerWidth).fHasError = local_3a4;
  (__return_storage_ptr__->integerWidth).fUnion = local_3ac;
  local_3c8 = Grouper::forProperties(properties);
  __return_storage_ptr__->grouper = local_3c8;
  local_3b8 = local_3c8;
  if (properties->formatWidth != -1) {
    local_3e8 = Padder::forProperties(properties);
    __return_storage_ptr__->padder = local_3e8;
    local_3d4 = local_3e8;
  }
  __return_storage_ptr__->decimal = (uint)((properties->decimalSeparatorAlwaysShown & 1U) != 0);
  __return_storage_ptr__->sign = (uint)((properties->signAlwaysShown & 1U) != 0);
  if (properties->minimumExponentDigits != -1) {
    if (maxFrac < 9) {
      if ((minFrac < maxFrac) && (1 < minFrac)) {
        minFrac = 1;
        IVar15 = IntegerWidth::zeroFillTo(1);
        local_448 = IVar15.fUnion;
        local_440 = IVar15.fHasError;
        local_438 = local_448;
        local_430 = local_440;
        IVar15 = IntegerWidth::truncateAt((IntegerWidth *)&local_438.minMaxInt,maxFrac);
        aStack_458 = IVar15.fUnion;
        local_450 = IVar15.fHasError;
        (__return_storage_ptr__->integerWidth).fUnion = aStack_458;
        (__return_storage_ptr__->integerWidth).fHasError = (bool)local_450;
        local_42c = aStack_458;
        local_424 = local_450;
      }
    }
    else {
      maxFrac = minFrac;
      IVar15 = IntegerWidth::zeroFillTo(minFrac);
      local_410 = IVar15.fUnion;
      local_408 = IVar15.fHasError;
      local_400 = local_410;
      local_3f8 = local_408;
      IVar15 = IntegerWidth::truncateAt((IntegerWidth *)&local_400.minMaxInt,maxFrac);
      local_420 = IVar15.fUnion;
      local_418 = IVar15.fHasError;
      (__return_storage_ptr__->integerWidth).fUnion = local_420;
      (__return_storage_ptr__->integerWidth).fHasError = (bool)local_418;
      local_3f4 = local_420;
      local_3ec = local_418;
    }
    if (maxFrac < 0) {
      local_718 = -1;
    }
    else {
      local_718 = maxFrac;
    }
    local_45c = local_718;
    ScientificNotation::ScientificNotation
              ((ScientificNotation *)&minInt_,(int8_t)local_718,local_718 == minFrac,
               (digits_t)properties->minimumExponentDigits,
               properties->exponentSignAlwaysShown & UNUM_SIGN_ALWAYS);
    *(undefined8 *)&__return_storage_ptr__->notation = _minInt_;
    (__return_storage_ptr__->notation).fUnion.scientific.fExponentSignDisplay = local_460;
    if ((__return_storage_ptr__->precision).fType == RND_FRACTION) {
      minFrac_ = properties->maximumIntegerDigits;
      maxFrac_ = properties->minimumIntegerDigits;
      local_474 = properties->minimumFractionDigits;
      local_478 = properties->maximumFractionDigits;
      if ((maxFrac_ == 0) && (local_478 == 0)) {
        Precision::unlimited();
        Precision::withMode(&local_498,&local_4b8,digits);
        (__return_storage_ptr__->precision).fType = local_498.fType;
        *(undefined4 *)&(__return_storage_ptr__->precision).field_0x4 = local_498._4_4_;
        (__return_storage_ptr__->precision).fUnion.fracSig = local_498.fUnion.fracSig;
        *(undefined8 *)((long)&(__return_storage_ptr__->precision).fUnion + 8) =
             local_498.fUnion._8_8_;
        (__return_storage_ptr__->precision).fRoundingMode = local_498.fRoundingMode;
      }
      else if ((maxFrac_ == 0) && (local_474 == 0)) {
        Precision::constructSignificant((Precision *)&minSig_,1,local_478 + 1);
        Precision::withMode(&local_4d8,(Precision *)&minSig_,digits);
        (__return_storage_ptr__->precision).fType = local_4d8.fType;
        *(undefined4 *)&(__return_storage_ptr__->precision).field_0x4 = local_4d8._4_4_;
        (__return_storage_ptr__->precision).fUnion.fracSig = local_4d8.fUnion.fracSig;
        *(undefined8 *)((long)&(__return_storage_ptr__->precision).fUnion + 8) =
             local_4d8.fUnion._8_8_;
        (__return_storage_ptr__->precision).fRoundingMode = local_4d8.fRoundingMode;
      }
      else {
        local_4fc = maxFrac_ + local_478;
        if ((maxFrac_ < minFrac_) && (1 < maxFrac_)) {
          maxFrac_ = 1;
        }
        local_500 = maxFrac_ + local_474;
        Precision::constructSignificant(&local_540,local_500,local_4fc);
        Precision::withMode(&local_520,&local_540,digits);
        (__return_storage_ptr__->precision).fType = local_520.fType;
        *(undefined4 *)&(__return_storage_ptr__->precision).field_0x4 = local_520._4_4_;
        (__return_storage_ptr__->precision).fUnion.fracSig = local_520.fUnion.fracSig;
        *(undefined8 *)((long)&(__return_storage_ptr__->precision).fUnion + 8) =
             local_520.fUnion._8_8_;
        (__return_storage_ptr__->precision).fRoundingMode = local_520.fRoundingMode;
      }
    }
  }
  bVar5 = NullableValue<UNumberCompactStyle>::isNull(&properties->compactStyle);
  if (!bVar5) {
    UVar8 = NullableValue<UNumberCompactStyle>::getNoError(&properties->compactStyle);
    if (UVar8 == UNUM_LONG) {
      NVar16 = Notation::compactLong();
      __return_storage_ptr__->notation = NVar16;
    }
    else {
      NVar16 = Notation::compactShort();
      __return_storage_ptr__->notation = NVar16;
    }
    __return_storage_ptr__->affixProvider = (AffixPatternProvider *)0x0;
  }
  scaleFromProperties((Scale *)&rounding_.fRoundingMode,properties);
  Scale::operator=(&__return_storage_ptr__->scale,(Scale *)&rounding_.fRoundingMode);
  Scale::~Scale((Scale *)&rounding_.fRoundingMode);
  if (exportedProperties != (DecimalFormatProperties *)0x0) {
    NullableValue<icu_63::CurrencyUnit>::operator=
              (&exportedProperties->currency,(CurrencyUnit *)local_160);
    NullableValue<UNumberFormatRoundingMode>::operator=
              (&exportedProperties->roundingMode,(UNumberFormatRoundingMode *)&digits);
    exportedProperties->minimumIntegerDigits = minFrac;
    if (maxFrac == -1) {
      local_740 = 0x7fffffff;
    }
    else {
      local_740 = maxFrac;
    }
    exportedProperties->maximumIntegerDigits = local_740;
    Precision::Precision((Precision *)local_5b8);
    if (local_2c0._0_4_ == RND_CURRENCY) {
      Precision::withCurrency
                ((Precision *)&maxFrac__1,(Precision *)local_2c0,(CurrencyUnit *)local_160,status);
      local_5b8 = (undefined1  [8])_maxFrac__1;
      rounding_._0_8_ = local_5d0.fracSig;
      rounding_.fUnion._0_2_ = local_5d0.increment.fMinFrac;
      rounding_.fUnion._2_2_ = local_5d0.increment.fMaxFrac;
      rounding_.fUnion._4_2_ = local_5d0._12_2_;
      rounding_.fUnion._6_2_ = local_5d0._14_2_;
      rounding_.fUnion._8_4_ = local_5c0;
    }
    else {
      local_5b8 = local_2c0;
      rounding_.fType = precision.fType;
      rounding_._4_4_ = precision._4_4_;
      rounding_.fUnion.fracSig = precision.fUnion.fracSig;
      rounding_.fUnion._8_4_ = precision.fUnion._8_4_;
    }
    minSig__1 = maxSig;
    maxSig__1 = minSig;
    increment_._4_4_ = roundingIncrement._4_4_;
    increment_._0_4_ = roundingIncrement._0_4_;
    local_5f0 = 0.0;
    if (local_5b8._0_4_ == RND_FRACTION) {
      minSig__1 = (int)(short)(undefined2)rounding_.fType;
      maxSig__1 = (int)(short)rounding_.fType._2_2_;
    }
    else if (local_5b8._0_4_ == RND_INCREMENT) {
      local_5f0 = (double)rounding_._0_8_;
      minSig__1 = (int)rounding_.fUnion.fracSig.fMinFrac;
      maxSig__1 = (int)rounding_.fUnion.fracSig.fMinFrac;
    }
    else if (local_5b8._0_4_ == RND_SIGNIFICANT) {
      increment_._4_4_ = (int)(short)rounding_._4_2_;
      increment_._0_4_ = (int)(short)rounding_._6_2_;
    }
    exportedProperties->minimumFractionDigits = minSig__1;
    exportedProperties->maximumFractionDigits = maxSig__1;
    exportedProperties->minimumSignificantDigits = increment_._4_4_;
    exportedProperties->maximumSignificantDigits = increment_._0_4_;
    exportedProperties->roundingIncrement = local_5f0;
  }
  locale._223_1_ = 1;
  CurrencyUnit::~CurrencyUnit((CurrencyUnit *)local_160);
  Locale::~Locale((Locale *)local_120);
  if ((locale._223_1_ & 1) == 0) {
    MacroProps::~MacroProps(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MacroProps NumberPropertyMapper::oldToNew(const DecimalFormatProperties& properties,
                                          const DecimalFormatSymbols& symbols,
                                          DecimalFormatWarehouse& warehouse,
                                          DecimalFormatProperties* exportedProperties,
                                          UErrorCode& status) {
    MacroProps macros;
    Locale locale = symbols.getLocale();

    /////////////
    // SYMBOLS //
    /////////////

    macros.symbols.setTo(symbols);

    //////////////////
    // PLURAL RULES //
    //////////////////

    if (!properties.currencyPluralInfo.fPtr.isNull()) {
        macros.rules = properties.currencyPluralInfo.fPtr->getPluralRules();
    }

    /////////////
    // AFFIXES //
    /////////////

    AffixPatternProvider* affixProvider;
    if (properties.currencyPluralInfo.fPtr.isNull()) {
        warehouse.currencyPluralInfoAPP.setToBogus();
        warehouse.propertiesAPP.setTo(properties, status);
        affixProvider = &warehouse.propertiesAPP;
    } else {
        warehouse.currencyPluralInfoAPP.setTo(*properties.currencyPluralInfo.fPtr, properties, status);
        warehouse.propertiesAPP.setToBogus();
        affixProvider = &warehouse.currencyPluralInfoAPP;
    }
    macros.affixProvider = affixProvider;

    ///////////
    // UNITS //
    ///////////

    bool useCurrency = (
            !properties.currency.isNull() || !properties.currencyPluralInfo.fPtr.isNull() ||
            !properties.currencyUsage.isNull() || affixProvider->hasCurrencySign());
    CurrencyUnit currency = resolveCurrency(properties, locale, status);
    UCurrencyUsage currencyUsage = properties.currencyUsage.getOrDefault(UCURR_USAGE_STANDARD);
    if (useCurrency) {
        // NOTE: Slicing is OK.
        macros.unit = currency; // NOLINT
    }
    warehouse.currencySymbols = {currency, locale, symbols, status};
    macros.currencySymbols = &warehouse.currencySymbols;

    ///////////////////////
    // ROUNDING STRATEGY //
    ///////////////////////

    int32_t maxInt = properties.maximumIntegerDigits;
    int32_t minInt = properties.minimumIntegerDigits;
    int32_t maxFrac = properties.maximumFractionDigits;
    int32_t minFrac = properties.minimumFractionDigits;
    int32_t minSig = properties.minimumSignificantDigits;
    int32_t maxSig = properties.maximumSignificantDigits;
    double roundingIncrement = properties.roundingIncrement;
    RoundingMode roundingMode = properties.roundingMode.getOrDefault(UNUM_ROUND_HALFEVEN);
    bool explicitMinMaxFrac = minFrac != -1 || maxFrac != -1;
    bool explicitMinMaxSig = minSig != -1 || maxSig != -1;
    // Resolve min/max frac for currencies, required for the validation logic and for when minFrac or
    // maxFrac was
    // set (but not both) on a currency instance.
    // NOTE: Increments are handled in "Precision.constructCurrency()".
    if (useCurrency && (minFrac == -1 || maxFrac == -1)) {
        int32_t digits = ucurr_getDefaultFractionDigitsForUsage(
                currency.getISOCurrency(), currencyUsage, &status);
        if (minFrac == -1 && maxFrac == -1) {
            minFrac = digits;
            maxFrac = digits;
        } else if (minFrac == -1) {
            minFrac = std::min(maxFrac, digits);
        } else /* if (maxFrac == -1) */ {
            maxFrac = std::max(minFrac, digits);
        }
    }
    // Validate min/max int/frac.
    // For backwards compatibility, minimum overrides maximum if the two conflict.
    // The following logic ensures that there is always a minimum of at least one digit.
    if (minInt == 0 && maxFrac != 0) {
        // Force a digit after the decimal point.
        minFrac = minFrac <= 0 ? 1 : minFrac;
        maxFrac = maxFrac < 0 ? -1 : maxFrac < minFrac ? minFrac : maxFrac;
        minInt = 0;
        maxInt = maxInt < 0 ? -1 : maxInt > kMaxIntFracSig ? -1 : maxInt;
    } else {
        // Force a digit before the decimal point.
        minFrac = minFrac < 0 ? 0 : minFrac;
        maxFrac = maxFrac < 0 ? -1 : maxFrac < minFrac ? minFrac : maxFrac;
        minInt = minInt <= 0 ? 1 : minInt > kMaxIntFracSig ? 1 : minInt;
        maxInt = maxInt < 0 ? -1 : maxInt < minInt ? minInt : maxInt > kMaxIntFracSig ? -1 : maxInt;
    }
    Precision precision;
    if (!properties.currencyUsage.isNull()) {
        precision = Precision::constructCurrency(currencyUsage).withCurrency(currency);
    } else if (roundingIncrement != 0.0) {
        precision = Precision::constructIncrement(roundingIncrement, minFrac);
    } else if (explicitMinMaxSig) {
        minSig = minSig < 1 ? 1 : minSig > kMaxIntFracSig ? kMaxIntFracSig : minSig;
        maxSig = maxSig < 0 ? kMaxIntFracSig : maxSig < minSig ? minSig : maxSig > kMaxIntFracSig
                                                                          ? kMaxIntFracSig : maxSig;
        precision = Precision::constructSignificant(minSig, maxSig);
    } else if (explicitMinMaxFrac) {
        precision = Precision::constructFraction(minFrac, maxFrac);
    } else if (useCurrency) {
        precision = Precision::constructCurrency(currencyUsage);
    }
    if (!precision.isBogus()) {
        precision = precision.withMode(roundingMode);
        macros.precision = precision;
    }

    ///////////////////
    // INTEGER WIDTH //
    ///////////////////

    macros.integerWidth = IntegerWidth(
            static_cast<digits_t>(minInt),
            static_cast<digits_t>(maxInt),
            properties.formatFailIfMoreThanMaxDigits);

    ///////////////////////
    // GROUPING STRATEGY //
    ///////////////////////

    macros.grouper = Grouper::forProperties(properties);

    /////////////
    // PADDING //
    /////////////

    if (properties.formatWidth != -1) {
        macros.padder = Padder::forProperties(properties);
    }

    ///////////////////////////////
    // DECIMAL MARK ALWAYS SHOWN //
    ///////////////////////////////

    macros.decimal = properties.decimalSeparatorAlwaysShown ? UNUM_DECIMAL_SEPARATOR_ALWAYS
                                                            : UNUM_DECIMAL_SEPARATOR_AUTO;

    ///////////////////////
    // SIGN ALWAYS SHOWN //
    ///////////////////////

    macros.sign = properties.signAlwaysShown ? UNUM_SIGN_ALWAYS : UNUM_SIGN_AUTO;

    /////////////////////////
    // SCIENTIFIC NOTATION //
    /////////////////////////

    if (properties.minimumExponentDigits != -1) {
        // Scientific notation is required.
        // This whole section feels like a hack, but it is needed for regression tests.
        // The mapping from property bag to scientific notation is nontrivial due to LDML rules.
        if (maxInt > 8) {
            // But #13110: The maximum of 8 digits has unknown origins and is not in the spec.
            // If maxInt is greater than 8, it is set to minInt, even if minInt is greater than 8.
            maxInt = minInt;
            macros.integerWidth = IntegerWidth::zeroFillTo(minInt).truncateAt(maxInt);
        } else if (maxInt > minInt && minInt > 1) {
            // Bug #13289: if maxInt > minInt > 1, then minInt should be 1.
            minInt = 1;
            macros.integerWidth = IntegerWidth::zeroFillTo(minInt).truncateAt(maxInt);
        }
        int engineering = maxInt < 0 ? -1 : maxInt;
        macros.notation = ScientificNotation(
                // Engineering interval:
                static_cast<int8_t>(engineering),
                // Enforce minimum integer digits (for patterns like "000.00E0"):
                (engineering == minInt),
                // Minimum exponent digits:
                static_cast<digits_t>(properties.minimumExponentDigits),
                // Exponent sign always shown:
                properties.exponentSignAlwaysShown ? UNUM_SIGN_ALWAYS : UNUM_SIGN_AUTO);
        // Scientific notation also involves overriding the rounding mode.
        // TODO: Overriding here is a bit of a hack. Should this logic go earlier?
        if (macros.precision.fType == Precision::PrecisionType::RND_FRACTION) {
            // For the purposes of rounding, get the original min/max int/frac, since the local
            // variables have been manipulated for display purposes.
            int maxInt_ = properties.maximumIntegerDigits;
            int minInt_ = properties.minimumIntegerDigits;
            int minFrac_ = properties.minimumFractionDigits;
            int maxFrac_ = properties.maximumFractionDigits;
            if (minInt_ == 0 && maxFrac_ == 0) {
                // Patterns like "#E0" and "##E0", which mean no rounding!
                macros.precision = Precision::unlimited().withMode(roundingMode);
            } else if (minInt_ == 0 && minFrac_ == 0) {
                // Patterns like "#.##E0" (no zeros in the mantissa), which mean round to maxFrac+1
                macros.precision = Precision::constructSignificant(1, maxFrac_ + 1).withMode(roundingMode);
            } else {
                int maxSig_ = minInt_ + maxFrac_;
                // Bug #20058: if maxInt_ > minInt_ > 1, then minInt_ should be 1.
                if (maxInt_ > minInt_ && minInt_ > 1) {
                    minInt_ = 1;
                }
                int minSig_ = minInt_ + minFrac_;
                // To avoid regression, maxSig is not reset when minInt_ set to 1.
                // TODO: Reset maxSig_ = 1 + minFrac_ to follow the spec.
                macros.precision = Precision::constructSignificant(minSig_, maxSig_).withMode(roundingMode);
            }
        }
    }

    //////////////////////
    // COMPACT NOTATION //
    //////////////////////

    if (!properties.compactStyle.isNull()) {
        if (properties.compactStyle.getNoError() == UNumberCompactStyle::UNUM_LONG) {
            macros.notation = Notation::compactLong();
        } else {
            macros.notation = Notation::compactShort();
        }
        // Do not forward the affix provider.
        macros.affixProvider = nullptr;
    }

    /////////////////
    // MULTIPLIERS //
    /////////////////

    macros.scale = scaleFromProperties(properties);

    //////////////////////
    // PROPERTY EXPORTS //
    //////////////////////

    if (exportedProperties != nullptr) {

        exportedProperties->currency = currency;
        exportedProperties->roundingMode = roundingMode;
        exportedProperties->minimumIntegerDigits = minInt;
        exportedProperties->maximumIntegerDigits = maxInt == -1 ? INT32_MAX : maxInt;

        Precision rounding_;
        if (precision.fType == Precision::PrecisionType::RND_CURRENCY) {
            rounding_ = precision.withCurrency(currency, status);
        } else {
            rounding_ = precision;
        }
        int minFrac_ = minFrac;
        int maxFrac_ = maxFrac;
        int minSig_ = minSig;
        int maxSig_ = maxSig;
        double increment_ = 0.0;
        if (rounding_.fType == Precision::PrecisionType::RND_FRACTION) {
            minFrac_ = rounding_.fUnion.fracSig.fMinFrac;
            maxFrac_ = rounding_.fUnion.fracSig.fMaxFrac;
        } else if (rounding_.fType == Precision::PrecisionType::RND_INCREMENT) {
            increment_ = rounding_.fUnion.increment.fIncrement;
            minFrac_ = rounding_.fUnion.increment.fMinFrac;
            maxFrac_ = rounding_.fUnion.increment.fMinFrac;
        } else if (rounding_.fType == Precision::PrecisionType::RND_SIGNIFICANT) {
            minSig_ = rounding_.fUnion.fracSig.fMinSig;
            maxSig_ = rounding_.fUnion.fracSig.fMaxSig;
        }

        exportedProperties->minimumFractionDigits = minFrac_;
        exportedProperties->maximumFractionDigits = maxFrac_;
        exportedProperties->minimumSignificantDigits = minSig_;
        exportedProperties->maximumSignificantDigits = maxSig_;
        exportedProperties->roundingIncrement = increment_;
    }

    return macros;
}